

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  bool bVar2;
  boolean bVar3;
  j_decompress_ptr in_RSI;
  long in_RDI;
  int usefast;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *in_stack_00000080;
  j_decompress_ptr in_stack_00000088;
  JBLOCKROW *in_stack_00000118;
  j_decompress_ptr in_stack_00000120;
  boolean local_4;
  
  lVar1 = *(long *)(in_RDI + 0x250);
  bVar2 = true;
  if (*(int *)(in_RDI + 0x170) != 0) {
    if ((*(int *)(lVar1 + 0x38) == 0) && (bVar3 = process_restart(in_RSI), bVar3 == 0)) {
      return 0;
    }
    bVar2 = false;
  }
  if ((*(ulong *)(*(long *)(in_RDI + 0x28) + 8) < (ulong)((long)*(int *)(in_RDI + 0x1e0) << 9)) ||
     (*(int *)(in_RDI + 0x21c) != 0)) {
    bVar2 = false;
  }
  if ((*(int *)(lVar1 + 0x10) != 0) ||
     (((bVar2 && (bVar3 = decode_mcu_fast(in_stack_00000120,in_stack_00000118), bVar3 != 0)) ||
      (bVar3 = decode_mcu_slow(in_stack_00000088,in_stack_00000080), bVar3 != 0)))) {
    if (*(int *)(in_RDI + 0x170) != 0) {
      *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

METHODDEF(boolean)
decode_mcu(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int usefast = 1;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
    usefast = 0;
  }

  if (cinfo->src->bytes_in_buffer < BUFSIZE * (size_t)cinfo->blocks_in_MCU ||
      cinfo->unread_marker != 0)
    usefast = 0;

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    if (usefast) {
      if (!decode_mcu_fast(cinfo, MCU_data)) goto use_slow;
    } else {
use_slow:
      if (!decode_mcu_slow(cinfo, MCU_data)) return FALSE;
    }

  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}